

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_MorphControl::MakeRational(ON_MorphControl *this)

{
  int iVar1;
  bool local_11;
  bool rc;
  ON_MorphControl *this_local;
  
  local_11 = false;
  iVar1 = this->m_varient;
  if (iVar1 == 1) {
    local_11 = ON_NurbsCurve::MakeRational(&this->m_nurbs_curve);
  }
  else if (iVar1 == 2) {
    local_11 = ON_NurbsSurface::MakeRational(&this->m_nurbs_surface);
  }
  else if (iVar1 == 3) {
    local_11 = ON_NurbsCage::MakeRational(&this->m_nurbs_cage);
  }
  return local_11;
}

Assistant:

bool ON_MorphControl::MakeRational()
{
  bool rc = false;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.MakeRational();
    break;
  case 2:
    rc = m_nurbs_surface.MakeRational();
    break;
  case 3:
    rc = m_nurbs_cage.MakeRational();
    break;
  }
  return rc;
}